

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::AddError
          (DescriptorBuilder *this,string_view element_name,Message *descriptor,
          ErrorLocation location,
          FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          make_error)

{
  ErrorCollector *pEVar1;
  undefined4 uVar2;
  size_type sVar3;
  undefined4 uVar4;
  pointer pcVar5;
  LogMessage *pLVar6;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string error;
  LogMessage local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  size_type local_38;
  pointer pcStack_30;
  
  (*make_error.invoker_)(&local_58,make_error.ptr_);
  pEVar1 = this->error_collector_;
  if (pEVar1 == (ErrorCollector *)0x0) {
    if (this->had_errors_ == false) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x144c);
      str._M_str = "Invalid proto descriptor for file \"";
      str._M_len = 0x23;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_68,str);
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_68,&this->filename_);
      str_00._M_str = "\":";
      str_00._M_len = 2;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar6,str_00);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_68);
    }
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x144f);
    str_01._M_str = "  ";
    str_01._M_len = 2;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_68,str_01);
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_68,element_name);
    str_02._M_str = ": ";
    str_02._M_len = 2;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar6,str_02);
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,&local_58);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_68);
  }
  else {
    local_38 = local_58._M_string_length;
    sVar3 = local_38;
    pcStack_30 = local_58._M_dataplus._M_p;
    pcVar5 = pcStack_30;
    local_38._0_4_ = (undefined4)local_58._M_string_length;
    uVar2 = (undefined4)local_38;
    pcStack_30._0_4_ = SUB84(local_58._M_dataplus._M_p,0);
    uVar4 = pcStack_30._0_4_;
    local_38 = sVar3;
    pcStack_30 = pcVar5;
    (*pEVar1->_vptr_ErrorCollector[2])
              (pEVar1,(this->filename_)._M_string_length,(this->filename_)._M_dataplus._M_p,
               element_name._M_len,element_name._M_str,descriptor,location,uVar2,uVar4);
  }
  this->had_errors_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void DescriptorBuilder::AddError(
    const absl::string_view element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    absl::FunctionRef<std::string()> make_error) {
  std::string error = make_error();
  if (error_collector_ == nullptr) {
    if (!had_errors_) {
      ABSL_LOG(ERROR) << "Invalid proto descriptor for file \"" << filename_
                      << "\":";
    }
    ABSL_LOG(ERROR) << "  " << element_name << ": " << error;
  } else {
    error_collector_->RecordError(filename_, element_name, &descriptor,
                                  location, error);
  }
  had_errors_ = true;
}